

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O1

int write_iff(lyout *out,lys_module *module,lys_iffeature *expr,int module_name_or_prefix,
             int *index_e,int *index_f)

{
  uint8_t uVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  char *pcVar9;
  bool bVar10;
  int local_44;
  int local_34;
  
  local_34 = 0;
  while( true ) {
    iVar3 = *index_e;
    uVar1 = iff_getop(expr->expr,iVar3);
    iVar6 = *index_e;
    *index_e = iVar6 + 1;
    if (uVar1 != '\0') break;
    iVar3 = ly_print(out,"not ");
    local_34 = local_34 + iVar3;
  }
  if (uVar1 == '\x01') {
    iVar4 = 0;
    bVar10 = iVar3 != 0;
    iVar3 = iVar4;
    if (((bVar10) && (0 < iVar6)) && (uVar2 = iff_getop(expr->expr,iVar6 + -1), uVar2 == '\0')) {
      iVar3 = 1;
    }
  }
  else if (uVar1 != '\x02') {
    if (uVar1 == '\x03') {
      plVar7 = lys_main_module(expr->features[*index_f]->module);
      plVar8 = lys_main_module(module);
      if (plVar7 == plVar8) {
        iVar3 = 0;
      }
      else {
        plVar7 = lys_main_module(expr->features[*index_f]->module);
        pcVar9 = plVar7->name;
        if (module_name_or_prefix == 0) {
          pcVar9 = transform_module_name2import_prefix(module,pcVar9);
        }
        iVar3 = ly_print(out,"%s:",pcVar9);
      }
      iVar6 = ly_print(out,expr->features[*index_f]->name);
      iVar6 = iVar6 + iVar3;
      *index_f = *index_f + 1;
    }
    else {
      iVar6 = 0;
    }
    goto LAB_00166623;
  }
  if (iVar3 == 0) {
    local_44 = 0;
  }
  else {
    local_44 = ly_print(out,"(");
  }
  iVar4 = write_iff(out,module,expr,module_name_or_prefix,index_e,index_f);
  pcVar9 = "and";
  if (uVar1 == '\x02') {
    pcVar9 = "or";
  }
  iVar6 = ly_print(out," %s ",pcVar9);
  iVar5 = write_iff(out,module,expr,module_name_or_prefix,index_e,index_f);
  iVar6 = iVar5 + iVar4 + local_44 + iVar6;
  if (iVar3 != 0) {
    iVar3 = ly_print(out,")");
    iVar6 = iVar6 + iVar3;
  }
LAB_00166623:
  return local_34 + iVar6;
}

Assistant:

static int
write_iff(struct lyout *out, const struct lys_module *module, struct lys_iffeature *expr, int module_name_or_prefix,
          int *index_e, int *index_f)
{
    int count = 0, brackets_flag = *index_e;
    uint8_t op;

    op = iff_getop(expr->expr, *index_e);
    (*index_e)++;

    switch (op) {
    case LYS_IFF_F:
        if (lys_main_module(expr->features[*index_f]->module) != lys_main_module(module)) {
            if (module_name_or_prefix) {
                count += ly_print(out, "%s:", lys_main_module(expr->features[*index_f]->module)->name);
            } else {
                count += ly_print(out, "%s:", transform_module_name2import_prefix(module, lys_main_module(expr->features[*index_f]->module)->name));
            }
        }
        count += ly_print(out, expr->features[*index_f]->name);
        (*index_f)++;
        break;
    case LYS_IFF_NOT:
        count += ly_print(out, "not ");
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        break;
    case LYS_IFF_AND:
        if (brackets_flag) {
            /* AND need brackets only if previous op was not */
            if (*index_e < 2 || iff_getop(expr->expr, *index_e - 2) != LYS_IFF_NOT) {
                brackets_flag = 0;
            }
        }
        /* no break */
    case LYS_IFF_OR:
        if (brackets_flag) {
            count += ly_print(out, "(");
        }
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        count += ly_print(out, " %s ", op == LYS_IFF_OR ? "or" : "and");
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        if (brackets_flag) {
            count += ly_print(out, ")");
        }
    }

    return count;
}